

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O0

int ARKBBDPrecReInit(void *arkode_mem,sunindextype mudq,sunindextype mldq,sunrealtype dqrely)

{
  long *plVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  double in_XMM0_Qa;
  int retval;
  sunindextype Nlocal;
  ARKBBDPrecData pdata;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffff60;
  ARKodeMem *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  long local_80;
  long local_70;
  long local_68;
  long local_60;
  long local_38;
  ARKodeMem local_30;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,in_stack_ffffffffffffff60);
  if (local_4 == 0) {
    if (*(long *)(local_38 + 0xe8) == 0) {
      arkProcessError(local_30,-5,0x133,"ARKBBDPrecReInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"BBD peconditioner memory is NULL. ARKBBDPrecInit must be called.");
      local_4 = -5;
    }
    else {
      plVar1 = *(long **)(local_38 + 0xe8);
      lVar2 = plVar1[0xf];
      local_60 = in_RSI;
      if (in_RSI < 0) {
        local_60 = 0;
      }
      if (lVar2 + -1 < local_60) {
        local_68 = lVar2 + -1;
      }
      else {
        local_70 = in_RSI;
        if (in_RSI < 0) {
          local_70 = 0;
        }
        local_68 = local_70;
      }
      *plVar1 = local_68;
      local_80 = in_RDX;
      if (in_RDX < 0) {
        local_80 = 0;
      }
      if (lVar2 + -1 < local_80) {
        in_RDX = lVar2 + -1;
      }
      else if (in_RDX < 0) {
        in_RDX = 0;
      }
      plVar1[1] = in_RDX;
      if (in_XMM0_Qa <= 0.0) {
        if (0.0 < local_30->uround) {
          in_XMM0_Qa = sqrt(local_30->uround);
        }
        else {
          in_XMM0_Qa = 0.0;
        }
      }
      plVar1[4] = (long)in_XMM0_Qa;
      plVar1[0x12] = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKBBDPrecReInit(void* arkode_mem, sunindextype mudq, sunindextype mldq,
                     sunrealtype dqrely)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  sunindextype Nlocal;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately ARKBBDPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BBD_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBBDPrecData)arkls_mem->P_data;

  /* Load half-bandwidths */
  Nlocal      = pdata->n_local;
  pdata->mudq = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));

  /* Set dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(ark_mem->uround);

  /* Re-initialize nge */
  pdata->nge = 0;

  return (ARKLS_SUCCESS);
}